

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::compareEqual<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,wchar_t[4]>
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *lhs,wchar_t (*rhs) [4])

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  bool bVar1;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_38;
  size_t local_28;
  wchar_t *local_20;
  wchar_t (*local_18) [4];
  wchar_t (*rhs_local) [4];
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *lhs_local;
  
  local_28 = lhs->_M_len;
  local_20 = lhs->_M_str;
  local_18 = rhs;
  rhs_local = (wchar_t (*) [4])lhs;
  clara::std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_38,*rhs);
  __x._M_str = local_20;
  __x._M_len = local_28;
  bVar1 = std::operator==(__x,local_38);
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }